

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O2

Roaring * __thiscall
doublechecked::Roaring::operator^(Roaring *__return_storage_ptr__,Roaring *this,Roaring *o)

{
  bool bVar1;
  Roaring *r;
  Roaring inplace;
  Roaring RStack_78;
  
  roaring::Roaring::operator^(&RStack_78.plain,&this->plain,&o->plain);
  Roaring(__return_storage_ptr__,&RStack_78.plain);
  roaring::Roaring::~Roaring(&RStack_78.plain);
  Roaring(&RStack_78,this);
  r = operator^=(&RStack_78,o);
  bVar1 = operator==(__return_storage_ptr__,r);
  _assert_true((ulong)bVar1,"ans == (inplace ^= o)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
               ,0x283);
  ~Roaring(&RStack_78);
  return __return_storage_ptr__;
}

Assistant:

Roaring operator^(const Roaring &o) const {
        Roaring ans(plain ^ o.plain);

        Roaring inplace(*this);
        assert_true(ans ==
                    (inplace ^= o));  // validate against in-place version

        return ans;
    }